

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_freeallobjects(lua_State *L)

{
  GCObject **p;
  global_State *pgVar1;
  GCObject *pGVar2;
  GCObject *pGVar3;
  global_State *pgVar4;
  
  pgVar1 = L->l_G;
  pGVar3 = (GCObject *)&pgVar1->tobefnz;
  do {
    pGVar2 = pGVar3;
    pGVar3 = pGVar2->next;
  } while (pGVar3 != (GCObject *)0x0);
  p = &pgVar1->finobj;
  pGVar3 = pgVar1->finobj;
  pgVar4 = pgVar1;
  if (pgVar1->finobj != (GCObject *)0x0) {
    do {
      *p = pGVar3->next;
      pGVar3->next = pGVar2->next;
      pGVar2->next = pGVar3;
      pGVar2 = pGVar3;
      pGVar3 = *p;
    } while (*p != (GCObject *)0x0);
    pgVar4 = L->l_G;
  }
  while (pgVar4->tobefnz != (GCObject *)0x0) {
    GCTM(L,0);
  }
  pgVar1->currentwhite = '\x03';
  pgVar1->gckind = '\0';
  sweeplist(L,p,0xffffffffffffffff);
  sweeplist(L,&pgVar1->allgc,0xffffffffffffffff);
  sweeplist(L,&pgVar1->fixedgc,0xffffffffffffffff);
  return;
}

Assistant:

void luaC_freeallobjects (lua_State *L) {
  global_State *g = G(L);
  luaC_changemode(L, KGC_INC);
  separatetobefnz(g, 1);  /* separate all objects with finalizers */
  lua_assert(g->finobj == NULL);
  callallpendingfinalizers(L);
  deletelist(L, g->allgc, obj2gco(g->mainthread));
  deletelist(L, g->finobj, NULL);
  deletelist(L, g->fixedgc, NULL);  /* collect fixed objects */
  lua_assert(g->strt.nuse == 0);
}